

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void la_func_end(TCGContext_conflict9 *s,int ng,int nt)

{
  int iVar1;
  int local_1c;
  int i;
  int nt_local;
  int ng_local;
  TCGContext_conflict9 *s_local;
  
  for (local_1c = 0; iVar1 = ng, local_1c < ng; local_1c = local_1c + 1) {
    s->temps[local_1c].state = 3;
    la_reset_pref(s,s->temps + local_1c);
  }
  while (local_1c = iVar1, local_1c < nt) {
    s->temps[local_1c].state = 1;
    la_reset_pref(s,s->temps + local_1c);
    iVar1 = local_1c + 1;
  }
  return;
}

Assistant:

static void la_func_end(TCGContext *s, int ng, int nt)
{
    int i;

    for (i = 0; i < ng; ++i) {
        s->temps[i].state = TS_DEAD | TS_MEM;
        la_reset_pref(s, &s->temps[i]);
    }
    for (i = ng; i < nt; ++i) {
        s->temps[i].state = TS_DEAD;
        la_reset_pref(s, &s->temps[i]);
    }
}